

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isxdigit.c
# Opt level: O1

int main(void)

{
  if (((0x61 < _PDCLIB_lc_ctype->Xdigits_low) || (_PDCLIB_lc_ctype->Xdigits_high < 0x61)) &&
     ((0x61 < _PDCLIB_lc_ctype->xdigits_low || (_PDCLIB_lc_ctype->xdigits_high < 0x61)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1f,"isxdigit( \'a\' )");
  }
  if (((0x66 < _PDCLIB_lc_ctype->Xdigits_low) || (_PDCLIB_lc_ctype->Xdigits_high < 0x66)) &&
     ((0x66 < _PDCLIB_lc_ctype->xdigits_low || (_PDCLIB_lc_ctype->xdigits_high < 0x66)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x20,"isxdigit( \'f\' )");
  }
  if (((_PDCLIB_lc_ctype->Xdigits_low < 0x68) && (0x66 < _PDCLIB_lc_ctype->Xdigits_high)) ||
     ((_PDCLIB_lc_ctype->xdigits_low < 0x68 && (0x66 < _PDCLIB_lc_ctype->xdigits_high)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x21,"! isxdigit( \'g\' )");
  }
  if (((0x41 < _PDCLIB_lc_ctype->Xdigits_low) || (_PDCLIB_lc_ctype->Xdigits_high < 0x41)) &&
     ((0x41 < _PDCLIB_lc_ctype->xdigits_low || (_PDCLIB_lc_ctype->xdigits_high < 0x41)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x22,"isxdigit( \'A\' )");
  }
  if (((0x46 < _PDCLIB_lc_ctype->Xdigits_low) || (_PDCLIB_lc_ctype->Xdigits_high < 0x46)) &&
     ((0x46 < _PDCLIB_lc_ctype->xdigits_low || (_PDCLIB_lc_ctype->xdigits_high < 0x46)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x23,"isxdigit( \'F\' )");
  }
  if (((_PDCLIB_lc_ctype->Xdigits_low < 0x48) && (0x46 < _PDCLIB_lc_ctype->Xdigits_high)) ||
     ((_PDCLIB_lc_ctype->xdigits_low < 0x48 && (0x46 < _PDCLIB_lc_ctype->xdigits_high)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x24,"! isxdigit( \'G\' )");
  }
  if (((_PDCLIB_lc_ctype->Xdigits_low < 0x41) && (0x3f < _PDCLIB_lc_ctype->Xdigits_high)) ||
     ((_PDCLIB_lc_ctype->xdigits_low < 0x41 && (0x3f < _PDCLIB_lc_ctype->xdigits_high)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x25,"! isxdigit( \'@\' )");
  }
  if (((_PDCLIB_lc_ctype->Xdigits_low < 0x21) && (0x1f < _PDCLIB_lc_ctype->Xdigits_high)) ||
     ((_PDCLIB_lc_ctype->xdigits_low < 0x21 && (0x1f < _PDCLIB_lc_ctype->xdigits_high)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x26,"! isxdigit( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int isxdigit( int c )
{
    return ( isdigit( c ) ||
             ( c >= _PDCLIB_lc_ctype->Xdigits_low && c <= _PDCLIB_lc_ctype->Xdigits_high ) ||
             ( c >= _PDCLIB_lc_ctype->xdigits_low && c <= _PDCLIB_lc_ctype->xdigits_high )
           );
}